

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O2

duckdb_value
duckdb_create_union_value(duckdb_logical_type union_type,idx_t tag_index,duckdb_value value)

{
  bool bVar1;
  uchar tag;
  idx_t iVar2;
  LogicalType *rhs;
  Value *this;
  LogicalType *type;
  child_list_t<LogicalType> cStack_e8;
  LogicalType local_d0;
  child_list_t<LogicalType> member_types;
  Value local_a0;
  Value local_60;
  
  if (((value != (duckdb_value)0x0 && union_type != (duckdb_logical_type)0x0) &&
      (*union_type == (_duckdb_logical_type)0x6b)) &&
     (iVar2 = duckdb::UnionType::GetMemberCount((LogicalType *)union_type), tag_index < iVar2)) {
    rhs = duckdb::UnionType::GetMemberType((LogicalType *)union_type,tag_index);
    bVar1 = duckdb::LogicalType::operator!=((LogicalType *)value,rhs);
    if (!bVar1) {
      duckdb::UnionType::CopyMemberTypes_abi_cxx11_(&member_types,(UnionType *)union_type,type);
      this = (Value *)operator_new(0x40);
      duckdb::LogicalType::LogicalType(&local_d0,SQLNULL);
      duckdb::Value::Value(this,&local_d0);
      duckdb::LogicalType::~LogicalType(&local_d0);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&cStack_e8,
               &member_types.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              );
      tag = duckdb::NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(tag_index);
      duckdb::Value::Value(&local_a0,(Value *)value);
      duckdb::Value::UNION(&local_60,&cStack_e8,tag,&local_a0);
      duckdb::Value::operator=(this,&local_60);
      duckdb::Value::~Value(&local_60);
      duckdb::Value::~Value(&local_a0);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&cStack_e8);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&member_types);
      return (duckdb_value)this;
    }
  }
  return (duckdb_value)0x0;
}

Assistant:

duckdb_value duckdb_create_union_value(duckdb_logical_type union_type, idx_t tag_index, duckdb_value value) {
	if (!union_type || !value) {
		return nullptr;
	}
	const auto &union_logical_type = UnwrapType(union_type);
	if (union_logical_type.id() != duckdb::LogicalTypeId::UNION) {
		return nullptr;
	}
	idx_t member_count = duckdb::UnionType::GetMemberCount(union_logical_type);
	if (tag_index >= member_count) {
		return nullptr;
	}
	const auto &member_type = duckdb::UnionType::GetMemberType(union_logical_type, tag_index);
	const auto &unwrapped_value = UnwrapValue(value);
	if (unwrapped_value.type() != member_type) {
		return nullptr;
	}
	const auto member_types = duckdb::UnionType::CopyMemberTypes(union_logical_type);
	duckdb::Value *union_value = new duckdb::Value;
	try {
		*union_value = duckdb::Value::UNION(member_types, duckdb::NumericCast<uint8_t>(tag_index), unwrapped_value);
	} catch (...) {
		delete union_value;
		return nullptr;
	}
	return WrapValue(union_value);
}